

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fpu_helper.c
# Opt level: O2

uint64_t helper_float_rsqrt2_d_mips(CPUMIPSState *env,uint64_t fdt0,uint64_t fdt2)

{
  float_status *s;
  float64 fVar1;
  uintptr_t unaff_retaddr;
  
  s = &(env->active_fpu).fp_status;
  fVar1 = float64_mul_mips(fdt0,fdt2,s);
  fVar1 = float64_sub_mips(fVar1,0x3ff0000000000000,s);
  fVar1 = float64_div_mips(fVar1,0x4000000000000000,s);
  update_fcr31(env,unaff_retaddr);
  return fVar1 ^ 0x8000000000000000;
}

Assistant:

uint64_t helper_float_rsqrt2_d(CPUMIPSState *env, uint64_t fdt0, uint64_t fdt2)
{
    fdt2 = float64_mul(fdt0, fdt2, &env->active_fpu.fp_status);
    fdt2 = float64_sub(fdt2, float64_one, &env->active_fpu.fp_status);
    fdt2 = float64_chs(float64_div(fdt2, FLOAT_TWO64,
                                       &env->active_fpu.fp_status));
    update_fcr31(env, GETPC());
    return fdt2;
}